

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::last_write_time(path *p,file_time_type new_time)

{
  bool bVar1;
  undefined8 uVar2;
  error_code *unaff_retaddr;
  path *in_stack_00000008;
  file_time_type in_stack_00000010;
  path *in_stack_00000020;
  string *in_stack_00000028;
  filesystem_error *in_stack_00000030;
  error_code in_stack_00000038;
  error_code ec;
  int in_stack_000001dc;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  error_code local_20 [2];
  
  std::error_code::error_code
            ((error_code *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  last_write_time(in_stack_00000008,in_stack_00000010,unaff_retaddr);
  bVar1 = std::error_code::operator_cast_to_bool(local_20);
  if (!bVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x90);
  std::error_code::value(local_20);
  detail::systemErrorText<int>(in_stack_000001dc);
  filesystem_error::filesystem_error
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000038);
  __cxa_throw(uVar2,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE void last_write_time(const path& p, file_time_type new_time)
{
    std::error_code ec;
    last_write_time(p, new_time, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
}